

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

bool ON_CRT_LOCALE::Validate_sprintf_s(void)

{
  bool bVar1;
  int printf_rc_00;
  int printf_rc;
  size_t buffer_capacity;
  char buffer [64];
  
  memset(&buffer_capacity,0,0x40);
  printf_rc_00 = snprintf((char *)&buffer_capacity,0x3f,m_validation_print_format,0x42a674e79c5fe480
                         );
  bVar1 = ValidateString((char *)&buffer_capacity,0x40,printf_rc_00);
  return bVar1;
}

Assistant:

static bool Validate_sprintf_s()
  {
#if defined(ON_COMPILER_CLANG)  || defined(ON_COMPILER_GNU)
    // Test formatted printing
    char buffer[64] = { 0 };
    size_t buffer_capacity = (sizeof(buffer) / sizeof(buffer[0])) - 1;
    // Testing C-runtime - do not using ON_String::FormatIntoBuffer
    int printf_rc = snprintf(buffer, buffer_capacity, m_validation_print_format, m_validation_value);
    return ValidateString(buffer, sizeof(buffer), printf_rc);
#else
    // Test formatted printing
    char buffer[64] = { 0 };
    size_t buffer_capacity = (sizeof(buffer) / sizeof(buffer[0])) - 1;
    // Testing C-runtime - do not using ON_String::FormatIntoBuffer
    int printf_rc = sprintf_s(buffer, buffer_capacity, m_validation_print_format, m_validation_value);
    return ValidateString(buffer, sizeof(buffer), printf_rc);
#endif
  }